

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringStream.c
# Opt level: O0

void sysbvm_stringStream_nextPutStringWithSize
               (sysbvm_context_t *context,sysbvm_tuple_t stringStream,size_t stringSize,char *string
               )

{
  _Bool _Var1;
  sysbvm_size_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_object_tuple_t *storage;
  size_t requiredCapacity;
  size_t capacity;
  size_t size;
  sysbvm_stringStream_t *stringStreamObject;
  char *string_local;
  size_t stringSize_local;
  sysbvm_tuple_t stringStream_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(stringStream);
  if ((_Var1) && (stringSize != 0)) {
    sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(stringStream + 0x10));
    sVar3 = sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(stringStream + 0x18));
    if (sVar3 < sVar2 + stringSize) {
      sysbvm_stringStream_increaseCapacityToAtLeast(context,stringStream,sVar2 + stringSize);
    }
    memcpy((void *)(*(long *)(stringStream + 0x18) + 0x10 + sVar2),string,stringSize);
    sVar4 = sysbvm_tuple_size_encode(context,sVar2 + stringSize);
    *(sysbvm_tuple_t *)(stringStream + 0x10) = sVar4;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_stringStream_nextPutStringWithSize(sysbvm_context_t *context, sysbvm_tuple_t stringStream, size_t stringSize, const char *string)
{
    if(!sysbvm_tuple_isNonNullPointer(stringStream) || stringSize == 0)
        return;

    sysbvm_stringStream_t *stringStreamObject = (sysbvm_stringStream_t*)stringStream;
    size_t size = sysbvm_tuple_size_decode(stringStreamObject->size);
    size_t capacity = sysbvm_tuple_getSizeInBytes(stringStreamObject->storage);
    size_t requiredCapacity = size + stringSize;
    if(requiredCapacity > capacity)
        sysbvm_stringStream_increaseCapacityToAtLeast(context, stringStream, requiredCapacity);

    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)stringStreamObject->storage;
    memcpy(storage->bytes + size, string, stringSize);
    stringStreamObject->size = sysbvm_tuple_size_encode(context, size + stringSize);
}